

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

BlockStatement *
slang::ast::createBlockStatement
          (Compilation *comp,SmallVectorBase<const_slang::ast::Statement_*> *buffer,
          SyntaxNode *syntax,StatementBlockKind blocKind)

{
  SmallVectorBase<const_slang::ast::Statement_*> *this;
  int iVar1;
  size_type sVar2;
  reference ppSVar3;
  undefined4 extraout_var;
  BlockStatement *pBVar4;
  EVP_PKEY_CTX *src;
  SourceRange local_50;
  span<const_slang::ast::Statement_*,_18446744073709551615UL> local_40;
  StatementList *local_30;
  Statement *body;
  SyntaxNode *pSStack_20;
  StatementBlockKind blocKind_local;
  SyntaxNode *syntax_local;
  SmallVectorBase<const_slang::ast::Statement_*> *buffer_local;
  Compilation *comp_local;
  
  body._4_4_ = blocKind;
  pSStack_20 = syntax;
  syntax_local = (SyntaxNode *)buffer;
  buffer_local = (SmallVectorBase<const_slang::ast::Statement_*> *)comp;
  sVar2 = SmallVectorBase<const_slang::ast::Statement_*>::size(buffer);
  this = buffer_local;
  if (sVar2 == 1) {
    ppSVar3 = SmallVectorBase<const_slang::ast::Statement_*>::operator[]
                        ((SmallVectorBase<const_slang::ast::Statement_*> *)syntax_local,0);
    local_30 = (StatementList *)*ppSVar3;
  }
  else {
    iVar1 = SmallVectorBase<const_slang::ast::Statement_*>::copy
                      ((SmallVectorBase<const_slang::ast::Statement_*> *)syntax_local,
                       (EVP_PKEY_CTX *)buffer_local,src);
    local_40.data_ = (pointer)CONCAT44(extraout_var,iVar1);
    local_50 = slang::syntax::SyntaxNode::sourceRange(pSStack_20);
    local_30 = BumpAllocator::
               emplace<slang::ast::StatementList,nonstd::span_lite::span<slang::ast::Statement_const*,18446744073709551615ul>,slang::SourceRange>
                         ((BumpAllocator *)this,&local_40,&local_50);
  }
  pBVar4 = BumpAllocator::
           emplace<slang::ast::BlockStatement,slang::ast::Statement_const&,slang::ast::StatementBlockKind&,slang::SourceRange_const&>
                     ((BumpAllocator *)buffer_local,&local_30->super_Statement,
                      (StatementBlockKind *)((long)&body + 4),
                      &(local_30->super_Statement).sourceRange);
  return pBVar4;
}

Assistant:

static BlockStatement* createBlockStatement(
    Compilation& comp, SmallVectorBase<const Statement*>& buffer, const SyntaxNode& syntax,
    StatementBlockKind blocKind = StatementBlockKind::Sequential) {

    const Statement* body;
    if (buffer.size() == 1)
        body = buffer[0];
    else
        body = comp.emplace<StatementList>(buffer.copy(comp), syntax.sourceRange());

    return comp.emplace<BlockStatement>(*body, blocKind, body->sourceRange);
}